

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool __thiscall xla::GraphCycles::InsertEdge(GraphCycles *this,int32_t x,int32_t y)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  Rep *r;
  pointer pNVar2;
  int *piVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  const_iterator __begin1;
  int *piVar7;
  const_iterator __end1;
  long lVar8;
  iterator iVar9;
  pointer piVar10;
  long lVar11;
  OrderedNodeSet *this_01;
  pointer pNVar12;
  int local_44;
  OrderedSet<int> *local_40;
  int local_34;
  
  if (x == y) {
    bVar6 = false;
  }
  else {
    r = this->rep_;
    this_01 = &(r->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start[x].out;
    bVar5 = OrderedSet<int>::Insert(this_01,y);
    bVar6 = true;
    if (bVar5) {
      pNVar12 = (r->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start + y;
      local_40 = this_01;
      OrderedSet<int>::Insert(&pNVar12->in,x);
      pNVar2 = (r->nodes_).
               super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pNVar2[y].rank < pNVar2[x].rank) {
        bVar6 = ForwardDFS(r,y,pNVar2[x].rank);
        if (!bVar6) {
          OrderedSet<int>::Erase(local_40,y);
          OrderedSet<int>::Erase(&pNVar12->in,x);
          piVar7 = (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar7 != piVar3) {
            pNVar2 = (r->nodes_).
                     super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              pNVar2[*piVar7].visited = false;
              piVar7 = piVar7 + 1;
            } while (piVar7 != piVar3);
          }
          return false;
        }
        iVar1 = pNVar2[y].rank;
        piVar10 = (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar10) {
          (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish = piVar10;
        }
        piVar10 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar9._M_current =
             (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current != piVar10) {
          (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar10;
          iVar9._M_current = piVar10;
        }
        this_00 = &r->stack_;
        local_44 = x;
        if (iVar9._M_current ==
            (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)this_00,iVar9,&local_44);
          piVar10 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar9._M_current = x;
          piVar10 = iVar9._M_current + 1;
          (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar10;
        }
        local_40 = (OrderedSet<int> *)&r->deltab_;
        if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start != piVar10) {
          do {
            local_44 = piVar10[-1];
            (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar10 + -1;
            pNVar2 = (r->nodes_).
                     super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pNVar2[local_44].visited == false) {
              pNVar2[local_44].visited = true;
              iVar9._M_current =
                   (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_40,iVar9,&local_44);
              }
              else {
                *iVar9._M_current = local_44;
                (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar9._M_current + 1;
              }
              pNVar12 = (r->node_io_).
                        super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar3 = *(pointer *)
                        ((long)&pNVar12[local_44].in.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_> + 8);
              for (piVar7 = *(int **)&pNVar12[local_44].in.value_sequence_.
                                      super__Vector_base<int,_std::allocator<int>_>;
                  piVar7 != piVar3; piVar7 = piVar7 + 1) {
                local_34 = *piVar7;
                pNVar2 = (r->nodes_).
                         super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((pNVar2[local_34].visited == false) && (iVar1 < pNVar2[local_34].rank)) {
                  iVar9._M_current =
                       (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar9._M_current ==
                      (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)this_00,iVar9,&local_34);
                  }
                  else {
                    *iVar9._M_current = local_34;
                    (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar9._M_current + 1;
                  }
                }
              }
            }
            piVar10 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          } while ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != piVar10);
        }
        Sort((xla *)r,(vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                       *)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
             (vector<int,_std::allocator<int>_> *)
             (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
        Sort((xla *)r,(vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                       *)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
             (vector<int,_std::allocator<int>_> *)
             (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
        piVar10 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != piVar10) {
          (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar10;
        }
        MoveToList(r,&local_40->value_sequence_,&r->list_);
        MoveToList(r,&r->deltaf_,&r->list_);
        std::vector<int,_std::allocator<int>_>::resize
                  (&r->merged_,
                   ((long)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) +
                   ((long)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::
        __merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->merged_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        piVar10 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar8 = (long)(r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar10;
        if (lVar8 != 0) {
          lVar8 = lVar8 >> 2;
          pNVar2 = (r->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar4 = (r->merged_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = 0;
          do {
            pNVar2[piVar10[lVar11]].rank = piVar4[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar8 + (ulong)(lVar8 == 0) != lVar11);
        }
      }
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool GraphCycles::InsertEdge(int32_t x, int32_t y) {
  if (x == y) return false;
  Rep* r = rep_;
  NodeIO* nx_io = &r->node_io_[x];
  if (!nx_io->out.Insert(y)) {
    // Edge already exists.
    return true;
  }

  NodeIO* ny_io = &r->node_io_[y];
  ny_io->in.Insert(x);

  Node* nx = &r->nodes_[x];
  Node* ny = &r->nodes_[y];
  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx_io->out.Erase(y);
    ny_io->in.Erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    ClearVisitedBits(r, r->deltaf_);
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}